

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall Lowerer::GenerateSwitchStringLookup(Lowerer *this,Instr *instr)

{
  uint index;
  long *plVar1;
  Func *func;
  RegOpnd *baseOpnd;
  LabelInstr *targetLabel;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  undefined4 *puVar5;
  MultiBranchInstr *pMVar6;
  RegOpnd *dst;
  IndirOpnd *src;
  IntConstOpnd *pIVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  Lowerer *this_00;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong local_40;
  
  if (instr->m_kind != InstrKindBranch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
    if (!bVar3) goto LAB_005bcfe4;
    *puVar5 = 0;
  }
  pMVar6 = IR::BranchInstr::AsMultiBrInstr((BranchInstr *)instr);
  plVar1 = (long *)pMVar6->m_branchTargets;
  if (*(int *)((long)plVar1 + 0x1c) == 0) {
    uVar13 = 0;
    uVar11 = 0xffffffff;
    local_40 = 0;
  }
  else {
    uVar13 = 0;
    uVar11 = 0xffffffff;
    uVar12 = 0;
    uVar9 = 0;
    do {
      iVar10 = *(int *)(*plVar1 + uVar9 * 4);
      while (iVar10 != -1) {
        lVar8 = (long)iVar10;
        iVar10 = *(int *)(plVar1[1] + 8 + lVar8 * 0x18);
        index = *(uint *)(*(long *)(plVar1[1] + 0x10 + lVar8 * 0x18) + 0x18);
        if (index <= uVar11) {
          uVar11 = index;
        }
        if (uVar13 <= index) {
          uVar13 = index;
        }
        if (index < 0x20) {
          BVUnitT<unsigned_int>::AssertRange(index);
          uVar12 = uVar12 | 1 << (index & 0x1f);
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < *(uint *)((long)plVar1 + 0x1c));
    local_40 = (ulong)uVar12;
  }
  func = instr->m_func;
  dst = IR::RegOpnd::New(TyUint32,func);
  baseOpnd = (RegOpnd *)instr->m_src1;
  OVar4 = IR::Opnd::GetKind((Opnd *)baseOpnd);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005bcfe4;
    *puVar5 = 0;
  }
  src = IR::IndirOpnd::New(baseOpnd,0x18,TyUint32,func,false);
  InsertMove(&dst->super_Opnd,&src->super_Opnd,instr,true);
  if (instr->m_kind != InstrKindBranch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
    if (!bVar3) {
LAB_005bcfe4:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pMVar6 = IR::BranchInstr::AsMultiBrInstr((BranchInstr *)instr);
  targetLabel = *(LabelInstr **)((long)pMVar6->m_branchTargets + 0x38);
  if (uVar11 == uVar13) {
    this_00 = (Lowerer *)(ulong)uVar11;
    pIVar7 = IR::IntConstOpnd::New((IntConstType)this_00,TyUint32,func,false);
    InsertCompareBranch(this_00,&dst->super_Opnd,&pIVar7->super_Opnd,BrNeq_A,false,targetLabel,instr
                        ,false);
  }
  else if (uVar13 < 0x20) {
    pIVar7 = IR::IntConstOpnd::New(local_40,TyUint32,func,false);
    InsertBitTestBranch(this,&pIVar7->super_Opnd,&dst->super_Opnd,false,targetLabel,instr);
    pIVar7 = IR::IntConstOpnd::New(0xffffffe0,TyUint32,func,false);
    InsertTest(&dst->super_Opnd,&pIVar7->super_Opnd,instr);
    InsertBranch(BrNeq_A,false,targetLabel,instr);
  }
  LowerMultiBr(this,instr,HelperOp_SwitchStringLookUp);
  return;
}

Assistant:

void Lowerer::GenerateSwitchStringLookup(IR::Instr * instr)
{
    /* Collect information about string length in all the case*/
    charcount_t minLength = UINT_MAX;
    charcount_t maxLength = 0;
    BVUnit32 bvLength;
    instr->AsBranchInstr()->AsMultiBrInstr()->GetBranchDictionary()->dictionary.Map([&](JITJavascriptString * str, void *)
    {
        charcount_t len = str->GetLength();
        minLength = min(minLength, str->GetLength());
        maxLength = max(maxLength, str->GetLength());
        if (len < 32)
        {
            bvLength.Set(len);
        }
    });

    Func * func = instr->m_func;
    IR::RegOpnd * strLengthOpnd = IR::RegOpnd::New(TyUint32, func);
    InsertMove(strLengthOpnd, IR::IndirOpnd::New(instr->GetSrc1()->AsRegOpnd(), Js::JavascriptString::GetOffsetOfcharLength(), TyUint32, func), instr);
    IR::LabelInstr * defaultLabelInstr = (IR::LabelInstr *)instr->AsBranchInstr()->AsMultiBrInstr()->GetBranchDictionary()->defaultTarget;
    if (minLength == maxLength)
    {
        // Generate single length filter
        InsertCompareBranch(strLengthOpnd, IR::IntConstOpnd::New(minLength, TyUint32, func), Js::OpCode::BrNeq_A, defaultLabelInstr, instr);
    }
    else if (maxLength < 32)
    {
        // Generate bit filter

        // Jump to default label if the bit is not on for the length % 32
        IR::IntConstOpnd * lenBitMaskOpnd = IR::IntConstOpnd::New(bvLength.GetWord(), TyUint32, func);
        InsertBitTestBranch(lenBitMaskOpnd, strLengthOpnd, false, defaultLabelInstr, instr);
        // Jump to default label if the bit is > 32
        InsertTestBranch(strLengthOpnd, IR::IntConstOpnd::New(UINT32_MAX ^ 31, TyUint32, func), Js::OpCode::BrNeq_A, defaultLabelInstr, instr);
    }
    else
    {
        // CONSIDER: Generate range filter
    }
    this->LowerMultiBr(instr, IR::HelperOp_SwitchStringLookUp);
}